

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>
::dx(FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>
     *this,int i)

{
  value_type *in_RDI;
  value_type *this_00;
  Fad<double> *in_stack_ffffffffffffffa0;
  Fad<double> *in_stack_ffffffffffffffa8;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *in_stack_ffffffffffffffb8;
  Fad<double> *in_stack_ffffffffffffffc0;
  
  this_00 = in_RDI;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
  ::dx((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
        *)in_RDI,(int)((ulong)in_RDI >> 0x20));
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
  ::dx((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
        *)this_00,(int)((ulong)in_RDI >> 0x20));
  operator-<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_RDI);
  Fad<double>::~Fad(in_RDI);
  Fad<double>::~Fad(in_RDI);
  return this_00;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) - right_.dx(i);}